

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O0

array<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_1UL>
 __thiscall inja::Renderer::get_arguments<1ul,1ul,true>(Renderer *this,FunctionNode *node)

{
  value_type pbVar1;
  size_type sVar2;
  __shared_ptr_access<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  size_type sVar4;
  reference ppbVar5;
  reference ppbVar6;
  reference ppDVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  value_type local_188;
  value_type data_node;
  size_t i_1;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong local_d8;
  size_t i;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  FunctionNode *local_20;
  FunctionNode *node_local;
  Renderer *this_local;
  array<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_1UL>
  result;
  
  local_20 = node;
  node_local = (FunctionNode *)this;
  sVar2 = std::
          vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
          ::size(&node->arguments);
  if (sVar2 < 2) {
    std::__cxx11::to_string(&local_a0,2);
    ::std::operator+(&local_80,"function needs ",&local_a0);
    ::std::operator+(&local_60,&local_80," variables, but has only found ");
    sVar2 = std::
            vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
            ::size(&local_20->arguments);
    std::__cxx11::to_string((string *)&i,sVar2);
    ::std::operator+(&local_40,&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
    throw_renderer_error(this,&local_40,(AstNode *)local_20);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&i);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
  }
  for (local_d8 = 1; local_d8 < 2; local_d8 = local_d8 + 1) {
    this_00 = (__shared_ptr_access<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
              )std::
               vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
               ::operator[](&local_20->arguments,local_d8);
    peVar3 = std::
             __shared_ptr_access<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (**(peVar3->super_AstNode)._vptr_AstNode)(peVar3,this);
  }
  sVar4 = std::
          stack<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_>
          ::size(&this->data_eval_stack);
  if (sVar4 == 0) {
    std::__cxx11::to_string(&local_158,1);
    ::std::operator+(&local_138,"function needs ",&local_158);
    ::std::operator+(&local_118,&local_138," variables, but has only found ");
    sVar4 = std::
            stack<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_>
            ::size(&this->data_eval_stack);
    std::__cxx11::to_string((string *)&i_1,sVar4);
    ::std::operator+(&local_f8,&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1);
    throw_renderer_error(this,&local_f8,(AstNode *)local_20);
    ::std::__cxx11::string::~string((string *)&local_f8);
    ::std::__cxx11::string::~string((string *)&i_1);
    ::std::__cxx11::string::~string((string *)&local_118);
    ::std::__cxx11::string::~string((string *)&local_138);
    ::std::__cxx11::string::~string((string *)&local_158);
  }
  for (data_node = (value_type)0x0; data_node == (value_type)0x0;
      data_node = (value_type)
                  ((long)&(data_node->super_ExpressionNode).super_AstNode._vptr_AstNode + 1)) {
    ppbVar5 = std::
              stack<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_>
              ::top(&this->data_eval_stack);
    pbVar1 = *ppbVar5;
    ppbVar6 = std::
              array<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_1UL>
              ::operator[]((array<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_1UL>
                            *)&this_local,-(long)data_node);
    *ppbVar6 = pbVar1;
    std::
    stack<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_>
    ::pop(&this->data_eval_stack);
    ppbVar6 = std::
              array<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_1UL>
              ::operator[]((array<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_1UL>
                            *)&this_local,-(long)data_node);
    if (*ppbVar6 == (value_type)0x0) {
      ppDVar7 = std::
                stack<const_inja::DataNode_*,_std::deque<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>_>
                ::top(&this->not_found_stack);
      local_188 = *ppDVar7;
      std::
      stack<const_inja::DataNode_*,_std::deque<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>_>
      ::pop(&this->not_found_stack);
      ::std::__cxx11::string::string((string *)&local_1e8,(string *)&local_188->name);
      ::std::operator+(&local_1c8,"variable \'",&local_1e8);
      ::std::operator+(&local_1a8,&local_1c8,"\' not found");
      throw_renderer_error(this,&local_1a8,(AstNode *)local_188);
      ::std::__cxx11::string::~string((string *)&local_1a8);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      ::std::__cxx11::string::~string((string *)&local_1e8);
    }
  }
  return (array<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_1UL>
          )(_Type)this_local;
}

Assistant:

std::array<const json*, N> get_arguments(const FunctionNode& node) {
    if (node.arguments.size() < N_start + N) {
      throw_renderer_error("function needs " + std::to_string(N_start + N) + " variables, but has only found " + std::to_string(node.arguments.size()), node);
    }

    for (size_t i = N_start; i < N_start + N; i += 1) {
      node.arguments[i]->accept(*this);
    }

    if (data_eval_stack.size() < N) {
      throw_renderer_error("function needs " + std::to_string(N) + " variables, but has only found " + std::to_string(data_eval_stack.size()), node);
    }

    std::array<const json*, N> result;
    for (size_t i = 0; i < N; i += 1) {
      result[N - i - 1] = data_eval_stack.top();
      data_eval_stack.pop();

      if (!result[N - i - 1]) {
        const auto data_node = not_found_stack.top();
        not_found_stack.pop();

        if (throw_not_found) {
          throw_renderer_error("variable '" + static_cast<std::string>(data_node->name) + "' not found", *data_node);
        }
      }
    }
    return result;
  }